

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_normal_transform(mat4 m)

{
  mat4 m_00;
  undefined1 auVar1 [56];
  mat4 m_01;
  mat4 *in_RDI;
  mat4 *pmVar2;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  auVar1 = m.m._0_56_;
  m_00.m._56_8_ = in_RDI;
  m_00.m[0] = (float)auVar1._0_4_;
  m_00.m[1] = (float)auVar1._4_4_;
  m_00.m[2] = (float)auVar1._8_4_;
  m_00.m[3] = (float)auVar1._12_4_;
  m_00.m[4] = (float)auVar1._16_4_;
  m_00.m[5] = (float)auVar1._20_4_;
  m_00.m[6] = (float)auVar1._24_4_;
  m_00.m[7] = (float)auVar1._28_4_;
  m_00.m[8] = (float)auVar1._32_4_;
  m_00.m[9] = (float)auVar1._36_4_;
  m_00.m[10] = (float)auVar1._40_4_;
  m_00.m[0xb] = (float)auVar1._44_4_;
  m_00.m[0xc] = (float)auVar1._48_4_;
  m_00.m[0xd] = (float)auVar1._52_4_;
  pmVar2 = in_RDI;
  mat4_inverse(m_00);
  m_01.m._8_8_ = local_38;
  m_01.m._0_8_ = uStack_40;
  m_01.m._16_8_ = uStack_30;
  m_01.m._24_8_ = local_28;
  m_01.m._32_8_ = uStack_20;
  m_01.m._40_8_ = local_18;
  m_01.m._48_8_ = uStack_10;
  m_01.m._56_8_ = pmVar2;
  mat4_transpose(m_01);
  return in_RDI;
}

Assistant:

mat4 mat4_normal_transform(mat4 m) {
    return mat4_transpose(mat4_inverse(m));
}